

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

int cmSystemTools::WaitForLine
              (cmsysProcess *process,string *line,cmDuration timeout,
              vector<char,_std::allocator<char>_> *out,vector<char,_std::allocator<char>_> *err)

{
  char cVar1;
  char *pcVar2;
  pointer pcVar3;
  pointer pcVar4;
  vector<char,_std::allocator<char>_> *pvVar5;
  int iVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  const_iterator cVar10;
  char *pcVar11;
  cmProcessOutput processOutput;
  int length;
  vector<char,_std::allocator<char>_> *local_c0;
  string *local_b8;
  double timeoutAsDbl;
  string strdata;
  char *data;
  cmsysProcess *local_80;
  rep local_78;
  string local_70;
  string local_50;
  
  line->_M_string_length = 0;
  *(line->_M_dataplus)._M_p = '\0';
  pcVar8 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pcVar9 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  local_b8 = line;
  local_80 = process;
  local_78 = timeout.__r;
  cmProcessOutput::cmProcessOutput(&processOutput,Auto,0x400);
  strdata._M_dataplus._M_p = (pointer)&strdata.field_2;
  strdata._M_string_length = 0;
  strdata.field_2._M_local_buf[0] = '\0';
LAB_0016792f:
  do {
    pcVar2 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    lVar7 = -(long)pcVar8;
    for (; pcVar11 = pcVar2, pcVar8 != pcVar2; pcVar8 = pcVar8 + 1) {
      cVar1 = *pcVar8;
      if (cVar1 == '\r') {
        pcVar11 = pcVar8;
        if (pcVar8 + 1 == pcVar2) break;
      }
      else if ((cVar1 == '\0') || (cVar1 == '\n')) {
        cVar10._M_current =
             (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_start;
        if ((1 < (ulong)-(long)(cVar10._M_current + lVar7)) || (pcVar8 != cVar10._M_current)) {
          std::__cxx11::string::append((char *)local_b8,(ulong)cVar10._M_current);
          cVar10._M_current =
               (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
        }
        std::vector<char,_std::allocator<char>_>::erase(out,cVar10,(const_iterator)(pcVar8 + 1));
        goto LAB_00167b0e;
      }
      lVar7 = lVar7 + -1;
    }
    pcVar8 = pcVar11;
    pcVar2 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    lVar7 = -(long)pcVar9;
    for (pcVar11 = pcVar9; pcVar9 = pcVar2, pcVar11 != pcVar2; pcVar11 = pcVar11 + 1) {
      cVar1 = *pcVar11;
      if (cVar1 == '\r') {
        pcVar9 = pcVar11;
        if (pcVar11 + 1 == pcVar2) break;
      }
      else if ((cVar1 == '\0') || (cVar1 == '\n')) {
        cVar10._M_current =
             (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_start;
        if ((1 < (ulong)-(long)(cVar10._M_current + lVar7)) || (pcVar11 != cVar10._M_current)) {
          std::__cxx11::string::append((char *)local_b8,(ulong)cVar10._M_current);
          cVar10._M_current =
               (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
        }
        std::vector<char,_std::allocator<char>_>::erase(err,cVar10,(const_iterator)(pcVar11 + 1));
        goto LAB_00167b35;
      }
      lVar7 = lVar7 + -1;
    }
    timeoutAsDbl = local_78;
    local_c0 = err;
    iVar6 = cmsysProcess_WaitForData(local_80,&data,&length,&timeoutAsDbl);
    if (iVar6 == 2) {
      cmProcessOutput::DecodeText(&processOutput,data,(long)length,&strdata,1);
      pcVar4 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pcVar3 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      ::cm::
      append<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (out,&strdata);
      pcVar8 = pcVar3 + ((long)(out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                               super__Vector_impl_data._M_start - (long)pcVar4);
      err = local_c0;
      goto LAB_0016792f;
    }
    if (iVar6 == 3) {
      cmProcessOutput::DecodeText(&processOutput,data,(long)length,&strdata,2);
      pvVar5 = local_c0;
      pcVar4 = (local_c0->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pcVar3 = (local_c0->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      ::cm::
      append<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (local_c0,&strdata);
      pcVar9 = pcVar3 + ((long)(pvVar5->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                               super__Vector_impl_data._M_start - (long)pcVar4);
      err = local_c0;
    }
    else {
      if (iVar6 == 0) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        local_50._M_string_length = 0;
        local_50.field_2._M_local_buf[0] = '\0';
        cmProcessOutput::DecodeText(&processOutput,&local_50,&strdata,1);
        std::__cxx11::string::~string((string *)&local_50);
        pvVar5 = local_c0;
        if (strdata._M_string_length != 0) {
          ::cm::
          append<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (out,&strdata);
        }
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        local_70._M_string_length = 0;
        local_70.field_2._M_local_buf[0] = '\0';
        cmProcessOutput::DecodeText(&processOutput,&local_70,&strdata,2);
        std::__cxx11::string::~string((string *)&local_70);
        if (strdata._M_string_length != 0) {
          ::cm::
          append<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (pvVar5,&strdata);
        }
        pcVar4 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (pcVar4 == (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_finish) {
          pcVar4 = (pvVar5->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if (pcVar4 == (pvVar5->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                        super__Vector_impl_data._M_finish) {
            iVar6 = 0;
          }
          else {
            std::__cxx11::string::append((char *)local_b8,(ulong)pcVar4);
            std::vector<char,_std::allocator<char>_>::erase
                      (pvVar5,(const_iterator)
                              (pvVar5->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                              super__Vector_impl_data._M_start,
                       (const_iterator)
                       (pvVar5->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                       super__Vector_impl_data._M_finish);
LAB_00167b35:
            iVar6 = 3;
          }
        }
        else {
          std::__cxx11::string::append((char *)local_b8,(ulong)pcVar4);
          std::vector<char,_std::allocator<char>_>::erase
                    (out,(const_iterator)
                         (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                         super__Vector_impl_data._M_start,
                     (const_iterator)
                     (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
LAB_00167b0e:
          iVar6 = 2;
        }
        goto LAB_00167b39;
      }
      err = local_c0;
      if (iVar6 == 0xff) {
        iVar6 = 0xff;
LAB_00167b39:
        std::__cxx11::string::~string((string *)&strdata);
        return iVar6;
      }
    }
  } while( true );
}

Assistant:

int cmSystemTools::WaitForLine(cmsysProcess* process, std::string& line,
                               cmDuration timeout, std::vector<char>& out,
                               std::vector<char>& err)
{
  line.clear();
  auto outiter = out.begin();
  auto erriter = err.begin();
  cmProcessOutput processOutput;
  std::string strdata;
  while (true) {
    // Check for a newline in stdout.
    for (; outiter != out.end(); ++outiter) {
      if ((*outiter == '\r') && ((outiter + 1) == out.end())) {
        break;
      }
      if (*outiter == '\n' || *outiter == '\0') {
        std::vector<char>::size_type length = outiter - out.begin();
        if (length > 1 && *(outiter - 1) == '\r') {
          --length;
        }
        if (length > 0) {
          line.append(out.data(), length);
        }
        out.erase(out.begin(), outiter + 1);
        return cmsysProcess_Pipe_STDOUT;
      }
    }

    // Check for a newline in stderr.
    for (; erriter != err.end(); ++erriter) {
      if ((*erriter == '\r') && ((erriter + 1) == err.end())) {
        break;
      }
      if (*erriter == '\n' || *erriter == '\0') {
        std::vector<char>::size_type length = erriter - err.begin();
        if (length > 1 && *(erriter - 1) == '\r') {
          --length;
        }
        if (length > 0) {
          line.append(err.data(), length);
        }
        err.erase(err.begin(), erriter + 1);
        return cmsysProcess_Pipe_STDERR;
      }
    }

    // No newlines found.  Wait for more data from the process.
    int length;
    char* data;
    double timeoutAsDbl = timeout.count();
    int pipe =
      cmsysProcess_WaitForData(process, &data, &length, &timeoutAsDbl);
    if (pipe == cmsysProcess_Pipe_Timeout) {
      // Timeout has been exceeded.
      return pipe;
    }
    if (pipe == cmsysProcess_Pipe_STDOUT) {
      processOutput.DecodeText(data, length, strdata, 1);
      // Append to the stdout buffer.
      std::vector<char>::size_type size = out.size();
      cm::append(out, strdata);
      outiter = out.begin() + size;
    } else if (pipe == cmsysProcess_Pipe_STDERR) {
      processOutput.DecodeText(data, length, strdata, 2);
      // Append to the stderr buffer.
      std::vector<char>::size_type size = err.size();
      cm::append(err, strdata);
      erriter = err.begin() + size;
    } else if (pipe == cmsysProcess_Pipe_None) {
      // Both stdout and stderr pipes have broken.  Return leftover data.
      processOutput.DecodeText(std::string(), strdata, 1);
      if (!strdata.empty()) {
        std::vector<char>::size_type size = out.size();
        cm::append(out, strdata);
        outiter = out.begin() + size;
      }
      processOutput.DecodeText(std::string(), strdata, 2);
      if (!strdata.empty()) {
        std::vector<char>::size_type size = err.size();
        cm::append(err, strdata);
        erriter = err.begin() + size;
      }
      if (!out.empty()) {
        line.append(out.data(), outiter - out.begin());
        out.erase(out.begin(), out.end());
        return cmsysProcess_Pipe_STDOUT;
      }
      if (!err.empty()) {
        line.append(err.data(), erriter - err.begin());
        err.erase(err.begin(), err.end());
        return cmsysProcess_Pipe_STDERR;
      }
      return cmsysProcess_Pipe_None;
    }
  }
}